

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressor.cpp
# Opt level: O2

uint64_t __thiscall
Imf_3_4::Compressor::runEncodeStep
          (Compressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  exr_encode_pipeline_t *peVar1;
  element_type p_Var2;
  int iVar3;
  ArgExc *this_00;
  exr_chunk_info_t cinfo;
  
  if (inSize == 0) {
    *outPtr = inPtr;
    return 0;
  }
  cinfo.sample_count_data_offset = 0;
  cinfo.sample_count_table_size = 0;
  cinfo.packed_size = 0;
  cinfo.unpacked_size = 0;
  cinfo.width = 0;
  cinfo.level_x = '\0';
  cinfo.level_y = '\0';
  cinfo.type = '\0';
  cinfo.compression = '\0';
  cinfo.data_offset = 0;
  cinfo.idx = 0;
  cinfo.start_x = 0;
  cinfo.start_y = 0;
  cinfo.height = 0;
  iVar3 = exr_chunk_default_initialize
                    (*(this->_ctxt)._ctxt.
                      super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0
                     ,range,this->_levelX,this->_levelY);
  if (iVar3 == 0) {
    cinfo.type = (char)this->_store_type;
    p_Var2 = *(this->_ctxt)._ctxt.
              super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar1 = &this->_encoder;
    if (this->_encoder_init == false) {
      iVar3 = exr_encoding_initialize(p_Var2,0,&cinfo,peVar1);
      if (iVar3 != 0) {
        this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(this_00,"Unable to initialize encoder type");
        goto LAB_0016179d;
      }
      this->_encoder_init = true;
    }
    else {
      iVar3 = exr_encoding_update(p_Var2,0,&cinfo,peVar1);
      if (iVar3 != 0) {
        this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(this_00,"Unable to update encoder type");
        goto LAB_0016179d;
      }
    }
    (this->_encoder).packed_buffer = inPtr;
    (this->_encoder).packed_bytes = (long)inSize;
    iVar3 = exr_compress_chunk(peVar1);
    if (iVar3 == 0) {
      *outPtr = (char *)(this->_encoder).compressed_buffer;
      (this->_encoder).packed_buffer = (void *)0x0;
      (this->_encoder).packed_bytes = 0;
      return (this->_encoder).compressed_bytes;
    }
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_00,"Unable to run compression routine");
  }
  else {
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_00,"Unable to initialize chunk information");
  }
LAB_0016179d:
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

uint64_t
Compressor::runEncodeStep (
    const char* inPtr,
    int inSize,
    IMATH_NAMESPACE::Box2i range,
    const char*& outPtr)
{
    // special case
    if (inSize == 0)
    {
        outPtr = inPtr;
        return 0;
    }

    exr_chunk_info_t cinfo = {0};

    if (EXR_ERR_SUCCESS != exr_chunk_default_initialize (
            _ctxt, 0, (const exr_attr_box2i_t*) &range, _levelX, _levelY, &cinfo))
        throw IEX_NAMESPACE::ArgExc ("Unable to initialize chunk information");

    cinfo.type = _store_type;
    if (!_encoder_init)
    {
        if (EXR_ERR_SUCCESS != exr_encoding_initialize(_ctxt, 0, &cinfo, &_encoder))
            throw IEX_NAMESPACE::ArgExc ("Unable to initialize encoder type");

        _encoder_init = true;
    }
    else
    {
        if (EXR_ERR_SUCCESS != exr_encoding_update(_ctxt, 0, &cinfo, &_encoder))
            throw IEX_NAMESPACE::ArgExc ("Unable to update encoder type");
    }

    _encoder.packed_buffer = const_cast<char*> (inPtr);
    _encoder.packed_bytes = inSize;

    if (EXR_ERR_SUCCESS != exr_compress_chunk(&_encoder))
        throw IEX_NAMESPACE::ArgExc ("Unable to run compression routine");

    outPtr = (const char*) _encoder.compressed_buffer;

    _encoder.packed_buffer = nullptr;
    _encoder.packed_bytes = 0;

    return _encoder.compressed_bytes;
}